

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O2

void __thiscall TestRunner::RunAll(TestRunner *this,TestSuite *ts)

{
  bool bVar1;
  uint uVar2;
  TestCase **ppTVar3;
  long lVar4;
  
  uVar2 = (ts->mTestCases).mSize;
  lVar4 = 0;
  while( true ) {
    if ((int)uVar2 <= lVar4) {
      return;
    }
    bVar1 = TestCase::Start((ts->mTestCases).mData[lVar4]);
    if (!bVar1) break;
    ppTVar3 = (ts->mTestCases).mData;
    if (ppTVar3[lVar4] == (TestCase *)0x0) {
      uVar2 = (ts->mTestCases).mSize;
    }
    else {
      (*ppTVar3[lVar4]->_vptr_TestCase[1])();
      uVar2 = (ts->mTestCases).mSize;
      ppTVar3 = (ts->mTestCases).mData;
    }
    ppTVar3[lVar4] = (TestCase *)0x0;
    lVar4 = lVar4 + 1;
  }
  exit(1);
}

Assistant:

void RunAll( TestSuite &ts )
	{
		for( int i = 0; i < (int)ts.mTestCases.size(); i++ )
		{
			LOG_NOTICE( "Running test %s", ts.mTestCases[ i ]->GetTestName() );
			if ( ts.mTestCases[ i ]->Start() == false )
			{
				exit( EXIT_FAILURE );
			}
			delete ts.mTestCases[ i ];
			ts.mTestCases[ i ] = NULL;
		}
	}